

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

void removeStringImpl<QStringView>(QString *s,QStringView *needle,CaseSensitivity cs)

{
  char16_t *pcVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  QArrayData *data;
  qsizetype qVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  char16_t *pcVar8;
  long lVar9;
  ulong uVar10;
  char16_t *pcVar11;
  long lVar12;
  char16_t *pcVar13;
  size_t __n;
  long in_FS_OFFSET;
  QStringView QVar14;
  QStringView haystack0;
  QStringView haystack0_00;
  QStringView needle0;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar12 = needle->m_size;
  if (lVar12 != 0) {
    pcVar2 = (s->d).ptr;
    qVar7 = (s->d).size;
    QVar14.m_data = pcVar2;
    QVar14.m_size = qVar7;
    needle0.m_data = needle->m_data;
    needle0.m_size = lVar12;
    qVar5 = QtPrivate::findString(QVar14,0,needle0,cs);
    if (-1 < qVar5) {
      pcVar1 = pcVar2 + qVar7;
      pDVar3 = (s->d).d;
      if ((pDVar3 == (Data *)0x0) ||
         (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QString::QString(&local_58,qVar7,Uninitialized);
        if ((local_58.d.d == (Data *)0x0) ||
           (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(&local_58,local_58.d.size,KeepSize);
        }
        pcVar11 = local_58.d.ptr;
        pcVar13 = local_58.d.ptr;
        if (qVar5 != 0) {
          uVar10 = qVar5 + 1;
          pcVar8 = pcVar2;
          do {
            *pcVar13 = *pcVar8;
            pcVar8 = pcVar8 + 1;
            pcVar13 = pcVar13 + 1;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
        }
        pcVar8 = pcVar2 + qVar5 + lVar12;
        if (pcVar8 < pcVar1) {
          QVar14 = *needle;
          pcVar4 = (s->d).ptr;
          qVar7 = (s->d).size;
          do {
            haystack0.m_data = pcVar4;
            haystack0.m_size = qVar7;
            qVar5 = QtPrivate::findString(haystack0,(long)pcVar8 - (long)pcVar2 >> 1,QVar14,cs);
            pcVar6 = pcVar2 + qVar5;
            if (qVar5 == -1) {
              pcVar6 = pcVar1;
            }
            lVar9 = (long)pcVar6 - (long)pcVar8 >> 1;
            if (0 < lVar9) {
              uVar10 = lVar9 + 1;
              do {
                *pcVar13 = *pcVar8;
                pcVar8 = pcVar8 + 1;
                pcVar13 = pcVar13 + 1;
                uVar10 = uVar10 - 1;
              } while (1 < uVar10);
            }
            pcVar8 = pcVar6 + lVar12;
          } while (pcVar8 < pcVar1);
        }
        QString::resize(&local_58,(long)pcVar13 - (long)pcVar11 >> 1);
        data = &((s->d).d)->super_QArrayData;
        pcVar2 = (s->d).ptr;
        (s->d).d = local_58.d.d;
        (s->d).ptr = local_58.d.ptr;
        qVar7 = (s->d).size;
        (s->d).size = local_58.d.size;
        local_58.d.d = (Data *)data;
        local_58.d.ptr = pcVar2;
        local_58.d.size = qVar7;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,2,0x10);
          }
        }
      }
      else {
        pcVar11 = pcVar2 + qVar5;
        pcVar13 = pcVar11 + lVar12;
        if (pcVar13 < pcVar1) {
          do {
            haystack0_00.m_data = (s->d).ptr;
            haystack0_00.m_size = (s->d).size;
            qVar7 = QtPrivate::findString(haystack0_00,(long)pcVar13 - (long)pcVar2 >> 1,*needle,cs)
            ;
            pcVar8 = pcVar2 + qVar7;
            if (qVar7 == -1) {
              pcVar8 = pcVar1;
            }
            __n = (long)pcVar8 - (long)pcVar13;
            if (__n != 0) {
              memmove(pcVar11,pcVar13,__n);
            }
            pcVar11 = (char16_t *)((long)pcVar11 + __n);
            pcVar13 = pcVar8 + lVar12;
          } while (pcVar13 < pcVar1);
          qVar7 = (s->d).size;
        }
        lVar12 = (long)pcVar11 - (long)pcVar2 >> 1;
        if (lVar12 < qVar7) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            QString::resize(s,lVar12);
            return;
          }
          goto LAB_00325b5c;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00325b5c:
  __stack_chk_fail();
}

Assistant:

static void removeStringImpl(QString &s, const T &needle, Qt::CaseSensitivity cs)
{
    const auto needleSize = needle.size();
    if (!needleSize)
        return;

    // avoid detach if nothing to do:
    qsizetype i = s.indexOf(needle, 0, cs);
    if (i < 0)
        return;

    QString::DataPointer &dptr = s.data_ptr();
    auto begin = dptr.begin();
    auto end = dptr.end();

    auto copyFunc = [&](auto &dst) {
        auto src = begin + i + needleSize;
        while (src < end) {
            i = s.indexOf(needle, std::distance(begin, src), cs);
            auto hit = i == -1 ? end : begin + i;
            dst = std::copy(src, hit, dst);
            src = hit + needleSize;
        }
        return dst;
    };

    if (!dptr->needsDetach()) {
        auto dst = begin + i;
        dst = copyFunc(dst);
        s.truncate(std::distance(begin, dst));
    } else {
        QString copy{s.size(), Qt::Uninitialized};
        auto copy_begin = copy.begin();
        auto dst = std::copy(begin, begin + i, copy_begin); // Chunk before the first hit
        dst = copyFunc(dst);
        copy.resize(std::distance(copy_begin, dst));
        s.swap(copy);
    }
}